

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format_newc.c
# Opt level: O0

int is_hex(char *p,size_t l)

{
  size_t local_20;
  size_t l_local;
  char *p_local;
  
  local_20 = l;
  l_local = (size_t)p;
  while( true ) {
    if (local_20 == 0) {
      return 1;
    }
    if ((((*(char *)l_local < '0') || ('9' < *(char *)l_local)) &&
        ((*(char *)l_local < 'a' || ('f' < *(char *)l_local)))) &&
       ((*(char *)l_local < 'A' || ('F' < *(char *)l_local)))) break;
    local_20 = local_20 - 1;
    l_local = l_local + 1;
  }
  return 0;
}

Assistant:

static int
is_hex(const char *p, size_t l)
{
	while (l > 0) {
		if ((*p >= '0' && *p <= '9')
		    || (*p >= 'a' && *p <= 'f')
		    || (*p >= 'A' && *p <= 'F'))
		{
			--l;
			++p;
		} else
			return (0);

	}
	return (1);
}